

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

bool __thiscall slang::SourceManager::isCached(SourceManager *this,path *path)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  __type_conflict2 _Var6;
  byte bVar7;
  uint uVar8;
  uint64_t uVar9;
  ulong uVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  path absPath;
  shared_lock<std::shared_mutex> lock;
  error_code ec;
  path local_b0;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  byte bStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  byte bStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  undefined1 local_68 [40];
  int local_40;
  undefined8 local_38;
  
  std::filesystem::__cxx11::path::path(&local_b0);
  if (this->disableProximatePaths == false) {
    local_40 = 0;
    local_38 = std::_V2::system_category();
    std::filesystem::weakly_canonical((path *)local_68,(error_code *)path);
    std::filesystem::__cxx11::path::operator=(&local_b0,(path *)local_68);
    std::filesystem::__cxx11::path::~path((path *)local_68);
    if (local_40 != 0) {
      bVar11 = false;
      goto LAB_001f6a11;
    }
  }
  else {
    std::filesystem::__cxx11::path::operator=(&local_b0,path);
  }
  local_68[8] = true;
  local_68._0_8_ = this;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  uVar9 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)&this->lookupCache,&local_b0._M_pathname);
  uVar12 = uVar9 >> ((byte)(this->lookupCache).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
                           .arrays.groups_size_index & 0x3f);
  lVar13 = (uVar9 & 0xff) * 4;
  uVar15 = (&UNK_0042856c)[lVar13];
  uVar16 = (&UNK_0042856d)[lVar13];
  uVar17 = (&UNK_0042856e)[lVar13];
  bVar18 = (&UNK_0042856f)[lVar13];
  uVar10 = 0;
  uVar19 = uVar15;
  uVar20 = uVar16;
  uVar21 = uVar17;
  bVar22 = bVar18;
  uVar23 = uVar15;
  uVar24 = uVar16;
  uVar25 = uVar17;
  bVar26 = bVar18;
  uVar27 = uVar15;
  uVar28 = uVar16;
  uVar29 = uVar17;
  bVar30 = bVar18;
  do {
    pgVar2 = (this->lookupCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar12;
    local_78 = pgVar1->m[0].n;
    uStack_77 = pgVar1->m[1].n;
    uStack_76 = pgVar1->m[2].n;
    bStack_75 = pgVar1->m[3].n;
    uStack_74 = pgVar1->m[4].n;
    uStack_73 = pgVar1->m[5].n;
    uStack_72 = pgVar1->m[6].n;
    bStack_71 = pgVar1->m[7].n;
    uStack_70 = pgVar1->m[8].n;
    uStack_6f = pgVar1->m[9].n;
    uStack_6e = pgVar1->m[10].n;
    bStack_6d = pgVar1->m[0xb].n;
    uStack_6c = pgVar1->m[0xc].n;
    uStack_6b = pgVar1->m[0xd].n;
    uStack_6a = pgVar1->m[0xe].n;
    bVar7 = pgVar1->m[0xf].n;
    auVar14[0] = -(local_78 == uVar15);
    auVar14[1] = -(uStack_77 == uVar16);
    auVar14[2] = -(uStack_76 == uVar17);
    auVar14[3] = -(bStack_75 == bVar18);
    auVar14[4] = -(uStack_74 == uVar19);
    auVar14[5] = -(uStack_73 == uVar20);
    auVar14[6] = -(uStack_72 == uVar21);
    auVar14[7] = -(bStack_71 == bVar22);
    auVar14[8] = -(uStack_70 == uVar23);
    auVar14[9] = -(uStack_6f == uVar24);
    auVar14[10] = -(uStack_6e == uVar25);
    auVar14[0xb] = -(bStack_6d == bVar26);
    auVar14[0xc] = -(uStack_6c == uVar27);
    auVar14[0xd] = -(uStack_6b == uVar28);
    auVar14[0xe] = -(uStack_6a == uVar29);
    auVar14[0xf] = -(bVar7 == bVar30);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
    bStack_69 = bVar7;
    if (uVar8 != 0) {
      ppVar3 = (this->lookupCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
               .arrays.elements_;
      local_88 = uVar15;
      uStack_87 = uVar16;
      uStack_86 = uVar17;
      bStack_85 = bVar18;
      uStack_84 = uVar19;
      uStack_83 = uVar20;
      uStack_82 = uVar21;
      bStack_81 = bVar22;
      uStack_80 = uVar23;
      uStack_7f = uVar24;
      uStack_7e = uVar25;
      bStack_7d = bVar26;
      uStack_7c = uVar27;
      uStack_7b = uVar28;
      uStack_7a = uVar29;
      bStack_79 = bVar30;
      do {
        uVar5 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        _Var6 = std::operator==(&local_b0._M_pathname,&ppVar3[uVar12 * 0xf + (ulong)uVar5].first);
        bVar11 = true;
        if (_Var6) goto LAB_001f6a07;
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
      bVar7 = pgVar2[uVar12].m[0xf].n;
      uVar15 = local_88;
      uVar16 = uStack_87;
      uVar17 = uStack_86;
      bVar18 = bStack_85;
      uVar19 = uStack_84;
      uVar20 = uStack_83;
      uVar21 = uStack_82;
      bVar22 = bStack_81;
      uVar23 = uStack_80;
      uVar24 = uStack_7f;
      uVar25 = uStack_7e;
      bVar26 = bStack_7d;
      uVar27 = uStack_7c;
      uVar28 = uStack_7b;
      uVar29 = uStack_7a;
      bVar30 = bStack_79;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar9 & 7] & bVar7) == 0) break;
    uVar4 = (this->lookupCache).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
            .arrays.groups_size_mask;
    lVar13 = uVar12 + uVar10;
    uVar10 = uVar10 + 1;
    uVar12 = lVar13 + 1U & uVar4;
  } while (uVar10 <= uVar4);
  bVar11 = false;
LAB_001f6a07:
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_68);
LAB_001f6a11:
  std::filesystem::__cxx11::path::~path(&local_b0);
  return bVar11;
}

Assistant:

bool SourceManager::isCached(const fs::path& path) const {
    fs::path absPath;
    if (!disableProximatePaths) {
        std::error_code ec;
        absPath = fs::weakly_canonical(path, ec);
        if (ec)
            return false;
    }
    else {
        absPath = path;
    }

    std::shared_lock<std::shared_mutex> lock(mutex);
    auto it = lookupCache.find(getU8Str(absPath));
    return it != lookupCache.end();
}